

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void file_opendir_cb(uv_fs_t *req)

{
  void *eval_b_3;
  void *eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_fs_t *req_local;
  
  if (req != &opendir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0xdf,"req","==","&opendir_req",req,"==",&opendir_req);
    abort();
  }
  if ((long)opendir_req.fs_type != 0x1f) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0xe0,"req->fs_type","==","UV_FS_OPENDIR",(long)opendir_req.fs_type,"==",0x1f);
    abort();
  }
  if (opendir_req.result != -0x14) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0xe1,"req->result","==","UV_ENOTDIR",opendir_req.result,"==",0xffffffffffffffec);
    abort();
  }
  if (opendir_req.ptr != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0xe2,"req->ptr","==","NULL",opendir_req.ptr,"==",0);
    abort();
  }
  uv_fs_req_cleanup(&opendir_req);
  file_opendir_cb_count = file_opendir_cb_count + 1;
  return;
}

Assistant:

static void file_opendir_cb(uv_fs_t* req) {
  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(req->result, UV_ENOTDIR);
  ASSERT_NULL(req->ptr);

  uv_fs_req_cleanup(req);
  ++file_opendir_cb_count;
}